

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall
amrex::MLMG::checkPoint
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_rhs,
          Real a_tol_rel,Real a_tol_abs,char *a_file_name)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  _Ios_Openmode __a;
  ostream *poVar4;
  MultiFab **ppMVar5;
  char *in_RCX;
  int *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int ilev_1;
  int ilev;
  ofstream HeaderFile;
  string HeaderFileName;
  string file_name;
  undefined1 in_stack_000008f3;
  How in_stack_000008f4;
  string *in_stack_000008f8;
  FabArray<amrex::FArrayBox> *in_stack_00000900;
  size_type in_stack_fffffffffffff988;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff990;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff998;
  ostream *in_stack_fffffffffffff9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffff9c0;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffff9c8;
  ostream *in_stack_fffffffffffff9d8;
  string local_460 [32];
  string local_440 [31];
  undefined1 in_stack_fffffffffffffbdf;
  string *in_stack_fffffffffffffbe0;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [36];
  int local_33c;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [36];
  int local_2d4;
  string local_2d0 [32];
  long local_2b0 [64];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  char *local_30;
  double local_28;
  double local_20;
  
  local_30 = in_RCX;
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,in_RCX,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  UtilCreateCleanDirectory(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffbdf);
  bVar1 = ParallelContext::IOProcessorSub();
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,local_30,&local_a9);
    std::operator+(in_stack_fffffffffffff998,(char *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::ofstream::ofstream(local_2b0);
    _Var3 = std::__cxx11::string::c_str();
    __a = std::operator|(_S_out,_S_trunc);
    std::operator|(__a,_S_bin);
    std::ofstream::open((char *)local_2b0,_Var3);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      FileOpenFailed((string *)in_stack_fffffffffffff9c8);
    }
    std::ios_base::precision((ios_base *)((long)local_2b0 + *(long *)(local_2b0[0] + -0x18)),0x11);
    (**(code **)(**(long **)(in_RDI + 0x12) + 0x10))(local_2d0);
    poVar4 = std::operator<<((ostream *)local_2b0,local_2d0);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"a_tol_rel = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"a_tol_abs = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"verbose = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*in_RDI);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"max_iters = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[1]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"nu1 = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[3]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"nu2 = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[4]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"nuf = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[5]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"nub = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[6]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"max_fmg_iters = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[7]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"bottom_solver = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[8]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"bottom_verbose = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[10]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"bottom_maxiter = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0xb]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"bottom_reltol = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(double *)(in_RDI + 0xc));
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"always_use_bnorm = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x10]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"namrlevs = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x14]);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"finest_amr_lev = ");
    in_stack_fffffffffffff9d8 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x15]);
    poVar4 = std::operator<<(in_stack_fffffffffffff9d8,"\n");
    in_stack_fffffffffffff9c8 =
         (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
          *)std::operator<<(poVar4,"linop_prepared = ");
    in_stack_fffffffffffff9c0 =
         (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
          *)std::ostream::operator<<(in_stack_fffffffffffff9c8,(bool)(*(byte *)(in_RDI + 0x16) & 1))
    ;
    in_stack_fffffffffffff9b8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<((ostream *)in_stack_fffffffffffff9c0,"\n");
    in_stack_fffffffffffff9b0 =
         std::operator<<((ostream *)in_stack_fffffffffffff9b8,"solve_called = ");
    poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff9b0,*(long *)(in_RDI + 0x18))
    ;
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_2d0);
    for (local_2d4 = 0; local_2d4 <= in_RDI[0x15]; local_2d4 = local_2d4 + 1) {
      std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
      std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      UtilCreateCleanDirectory(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffbdf);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string(local_318);
    }
    std::ofstream::~ofstream(local_2b0);
    std::__cxx11::string::~string(local_88);
  }
  ParallelContext::BarrierSub();
  for (local_33c = 0; local_33c <= in_RDI[0x15]; local_33c = local_33c + 1) {
    Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
    std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    std::operator+(in_stack_fffffffffffff998,(char *)in_stack_fffffffffffff990);
    VisMF::Write(in_stack_00000900,in_stack_000008f8,in_stack_000008f4,(bool)in_stack_000008f3);
    std::__cxx11::string::~string(local_360);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::string::~string(local_3a0);
    ppMVar5 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                        ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    in_stack_fffffffffffff998 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppMVar5;
    std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
    std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    std::operator+(in_stack_fffffffffffff998,(char *)in_stack_fffffffffffff990);
    VisMF::Write(in_stack_00000900,in_stack_000008f8,in_stack_000008f4,(bool)in_stack_000008f3);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbe0);
  }
  plVar6 = *(long **)(in_RDI + 0x12);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  (**(code **)(*plVar6 + 0x220))(plVar6,local_460);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void
MLMG::checkPoint (const Vector<MultiFab*>& a_sol, const Vector<MultiFab const*>& a_rhs,
                  Real a_tol_rel, Real a_tol_abs, const char* a_file_name) const
{
    std::string file_name(a_file_name);
    UtilCreateCleanDirectory(file_name, false);

    if (ParallelContext::IOProcessorSub())
    {
        std::string HeaderFileName(std::string(a_file_name)+"/Header");
        std::ofstream HeaderFile;
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                std::ofstream::trunc |
                                                std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        HeaderFile.precision(17);

        HeaderFile << linop.name() << "\n"
                   << "a_tol_rel = " << a_tol_rel << "\n"
                   << "a_tol_abs = " << a_tol_abs << "\n"
                   << "verbose = " << verbose << "\n"
                   << "max_iters = " << max_iters << "\n"
                   << "nu1 = " << nu1 << "\n"
                   << "nu2 = " << nu2 << "\n"
                   << "nuf = " << nuf << "\n"
                   << "nub = " << nub << "\n"
                   << "max_fmg_iters = " << max_fmg_iters << "\n"
                   << "bottom_solver = " << static_cast<int>(bottom_solver) << "\n"
                   << "bottom_verbose = " << bottom_verbose << "\n"
                   << "bottom_maxiter = " << bottom_maxiter << "\n"
                   << "bottom_reltol = " << bottom_reltol << "\n"
                   << "always_use_bnorm = " << always_use_bnorm << "\n"
                   << "namrlevs = " << namrlevs << "\n"
                   << "finest_amr_lev = " << finest_amr_lev << "\n"
                   << "linop_prepared = " << linop_prepared << "\n"
                   << "solve_called = " << solve_called << "\n";

        for (int ilev = 0; ilev <= finest_amr_lev; ++ilev) {
            UtilCreateCleanDirectory(file_name+"/Level_"+std::to_string(ilev), false);
        }
    }

    ParallelContext::BarrierSub();

    for (int ilev = 0; ilev <= finest_amr_lev; ++ilev) {
        VisMF::Write(*a_sol[ilev], file_name+"/Level_"+std::to_string(ilev)+"/sol");
        VisMF::Write(*a_rhs[ilev], file_name+"/Level_"+std::to_string(ilev)+"/rhs");
    }

    linop.checkPoint(file_name+"/linop");
}